

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O2

int i2c_read_block_data(int pi,uint handle,uint reg,char *buf)

{
  int sent;
  
  sent = pigpio_command(pi,0x41,handle,reg,0);
  if (0 < sent) {
    sent = recvMax(pi,buf,0x20,sent);
  }
  _pmu(pi);
  return sent;
}

Assistant:

int i2c_read_block_data(int pi, unsigned handle, unsigned reg, char *buf)
{
   int bytes;

   bytes = pigpio_command(pi, PI_CMD_I2CRK, handle, reg, 0);

   if (bytes > 0)
   {
      bytes = recvMax(pi, buf, 32, bytes);
   }

   _pmu(pi);

   return bytes;
}